

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

void __thiscall Assimp::FICDATAValueImpl::~FICDATAValueImpl(FICDATAValueImpl *this)

{
  FICDATAValueImpl *this_local;
  
  ~FICDATAValueImpl(this);
  operator_delete(this);
  return;
}

Assistant:

virtual const std::string &toString() const /*override*/ { return value; }